

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O0

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::factory<std::function<double(double)>>
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,size_t N,
          function<double_(double)> *func,double xmin,double xmax)

{
  CoeffReturnType pdVar1;
  Scalar *pSVar2;
  double dVar3;
  double x_k;
  undefined1 *puStack_50;
  int k;
  undefined1 local_48 [8];
  VectorXd f;
  VectorXd *x_nodes_n11;
  double xmax_local;
  double xmin_local;
  function<double_(double)> *func_local;
  size_t N_local;
  
  f.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)get_CLnodes((size_t)this);
  puStack_50 = (undefined1 *)
               ((long)&(this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + 1);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_48,(unsigned_long *)&stack0xffffffffffffffb0);
  for (x_k._4_4_ = 0; (ChebyshevExpansion *)(long)x_k._4_4_ <= this; x_k._4_4_ = x_k._4_4_ + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        f.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows,(long)x_k._4_4_);
    dVar3 = std::function<double_(double)>::operator()
                      ((function<double_(double)> *)N,((xmax - xmin) * *pdVar1 + xmax + xmin) * 0.5)
    ;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_48,
                        (long)x_k._4_4_);
    *pSVar2 = dVar3;
  }
  factoryf(__return_storage_ptr__,(size_t)this,(VectorXd *)local_48,xmin,xmax);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static ChebyshevExpansion factory(const std::size_t N, const double_function& func, const double xmin, const double xmax)
        {
            // Get the precalculated Chebyshev-Lobatto nodes
            const Eigen::VectorXd & x_nodes_n11 = get_CLnodes(N);

            // Step 1&2: Grid points functional values (function evaluated at the
            // extrema of the Chebyshev polynomial of order N - there are N+1 of them)
            Eigen::VectorXd f(N + 1);
            for (int k = 0; k <= N; ++k) {
                // The extrema in [-1,1] scaled to real-world coordinates
                double x_k = ((xmax - xmin)*x_nodes_n11(k) + (xmax + xmin)) / 2.0;
                f(k) = func(x_k);
            }
            return factoryf(N, f, xmin, xmax);
        }